

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_26382a::SwiftCompilerShellCommand::configureAttribute
          (SwiftCompilerShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  StringRef value_00;
  StringRef value_01;
  StringRef value_02;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  ConfigureContext *this_00;
  size_t sVar1;
  type tVar2;
  size_t sVar3;
  bool bVar4;
  bool local_1259;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1219;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1218;
  StringRef local_1200;
  StringRef local_11f0;
  undefined1 local_11e0 [8];
  SmallVector<llvm::StringRef,_32U> args;
  string local_fb0;
  Twine local_f90;
  Twine local_f78;
  Twine local_f60;
  Twine local_f48;
  Twine local_f30;
  Twine local_f18;
  int local_efc;
  char *pcStack_ef8;
  int numThreadsInt;
  void *local_ee8;
  size_t local_ee0;
  SwiftCompilerShellCommand *local_ed8;
  char *local_ed0;
  size_t local_ec8;
  size_t local_ec0;
  char *local_eb8 [2];
  void *local_ea8;
  size_t local_ea0;
  SwiftCompilerShellCommand *local_e98;
  char *local_e90;
  size_t local_e88;
  size_t local_e80;
  char *local_e78 [2];
  void *local_e68;
  size_t local_e60;
  string local_e58;
  char *local_e38 [2];
  void *local_e28;
  size_t local_e20;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e10;
  StringRef local_df8;
  StringRef local_de8;
  undefined1 local_dd8 [8];
  SmallVector<llvm::StringRef,_32U> imports;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ba1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ba0;
  StringRef local_b88;
  StringRef local_b78;
  undefined1 local_b68 [8];
  SmallVector<llvm::StringRef,_32U> objects;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_931;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_930;
  StringRef local_918;
  StringRef local_908;
  undefined1 local_8f8 [8];
  SmallVector<llvm::StringRef,_32U> sources;
  string local_6c8;
  char *local_6a8 [2];
  void *local_698;
  size_t local_690;
  string local_688;
  char *local_668 [2];
  void *local_658;
  size_t local_650;
  string local_648;
  char *local_628 [2];
  char *local_618;
  size_t local_610;
  ConfigureContext *local_608;
  ConfigureContext *ctx_local;
  SwiftCompilerShellCommand *this_local;
  StringRef value_local;
  StringRef name_local;
  size_t local_5b0;
  size_t local_5a8;
  char *local_5a0;
  size_t local_598;
  char *local_590;
  size_t local_588;
  void *local_580;
  size_t local_578;
  char *local_570;
  size_t local_568;
  char *local_560;
  size_t local_558;
  void *local_550;
  size_t local_548;
  char *local_540;
  size_t local_538;
  char *local_530;
  size_t local_528;
  void *local_520;
  size_t local_518;
  char *local_510;
  size_t local_508;
  char *local_500;
  size_t local_4f8;
  void *local_4f0;
  size_t local_4e8;
  char local_4e0 [8];
  size_t local_4d8;
  char local_4d0 [8];
  size_t local_4c8;
  size_t local_4c0;
  size_t local_4b8;
  char local_4b0 [8];
  size_t local_4a8;
  char local_4a0 [8];
  size_t local_498;
  size_t local_490;
  size_t local_488;
  char local_480 [8];
  size_t local_478;
  char local_470 [8];
  size_t local_468;
  size_t local_460;
  size_t local_458;
  char *local_450;
  size_t local_448;
  char *local_440;
  size_t local_438;
  void *local_430;
  size_t local_428;
  char *local_420;
  size_t local_418;
  char *local_410;
  size_t local_408;
  void *local_400;
  size_t local_3f8;
  char *local_3f0;
  size_t local_3e8;
  char *local_3e0;
  size_t local_3d8;
  char *local_3d0;
  size_t local_3c8;
  char **local_3c0;
  char *local_3b8;
  size_t local_3b0;
  void **local_3a8;
  char *local_3a0;
  size_t local_398;
  void **local_390;
  char *local_388;
  size_t local_380;
  size_t *local_378;
  char local_370 [8];
  size_t local_368;
  size_t *local_360;
  char local_358 [8];
  size_t local_350;
  size_t *local_348;
  char local_340 [8];
  size_t local_338;
  void **local_330;
  char *local_328;
  size_t local_320;
  void **local_318;
  char *local_310;
  size_t local_308;
  void **local_300;
  char *local_2f8;
  size_t local_2f0;
  void **local_2e8;
  char *local_2e0;
  size_t local_2d8;
  size_t *local_2d0;
  char local_2c8 [8];
  size_t local_2c0;
  size_t local_2b8;
  char local_2b0 [8];
  size_t local_2a8;
  int local_29c;
  size_t local_298;
  char *local_290;
  void *local_288;
  int local_27c;
  size_t local_278;
  char *local_270;
  void *local_268;
  int local_25c;
  size_t local_258;
  char *local_250;
  void *local_248;
  int local_23c;
  size_t local_238;
  char *local_230;
  void *local_228;
  int local_21c;
  size_t local_218;
  char local_210 [8];
  size_t local_208;
  int local_1fc;
  size_t local_1f8;
  char local_1f0 [8];
  size_t local_1e8;
  int local_1dc;
  size_t local_1d8;
  char local_1d0 [8];
  size_t local_1c8;
  int local_1bc;
  size_t local_1b8;
  char *local_1b0;
  void *local_1a8;
  int local_19c;
  size_t local_198;
  char *local_190;
  void *local_188;
  int local_17c;
  size_t local_178;
  char *local_170;
  char *local_168;
  int local_15c;
  char *local_158;
  char **local_150;
  char *local_148;
  char **local_140;
  char *local_138;
  char **local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  StringRef *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  StringRef *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  StringRef *local_d0;
  char *local_c8;
  char **local_c0;
  char *local_b8;
  char **local_b0;
  char *local_a8;
  char **local_a0;
  char *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  StringRef *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  SmallVectorBase *local_48;
  SmallVectorBase *local_40;
  SmallVectorBase *local_38;
  SmallVectorBase *local_30;
  SmallVectorBase *local_28;
  SmallVectorBase *local_20;
  SmallVectorBase *local_18;
  SmallVectorBase *local_10;
  
  value_local.Data = (char *)value.Length;
  this_local = (SwiftCompilerShellCommand *)value.Data;
  sVar3 = name.Length;
  local_618 = name.Data;
  local_150 = local_628;
  local_158 = "executable";
  local_628[0] = "executable";
  local_610 = sVar3;
  local_608 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_618;
  local_3e8 = strlen("executable");
  local_3d0 = local_618;
  local_3c8 = local_610;
  local_3e0 = local_628[0];
  local_3f0 = local_628[0];
  local_3b8 = local_628[0];
  local_3c0 = &local_3d0;
  local_1259 = false;
  local_3d8 = local_3e8;
  local_3b0 = local_3e8;
  if (local_610 == local_3e8) {
    local_168 = local_618;
    local_170 = local_628[0];
    local_178 = local_3e8;
    if (local_3e8 == 0) {
      local_15c = 0;
    }
    else {
      local_15c = memcmp(local_618,local_628[0],local_3e8);
    }
    local_1259 = local_15c == 0;
  }
  if (local_1259) {
    llvm::StringRef::operator_cast_to_string(&local_648,(StringRef *)&this_local);
    std::__cxx11::string::operator=((string *)&this->executable,(string *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
  }
  else {
    local_658 = (void *)value_local.Length;
    local_140 = local_668;
    local_148 = "module-name";
    local_668[0] = "module-name";
    local_650 = sVar3;
    local_418 = strlen("module-name");
    local_400 = local_658;
    local_3f8 = local_650;
    local_410 = local_668[0];
    local_420 = local_668[0];
    local_3a0 = local_668[0];
    local_3a8 = &local_400;
    bVar4 = false;
    local_408 = local_418;
    local_398 = local_418;
    if (local_650 == local_418) {
      local_188 = local_658;
      local_190 = local_668[0];
      local_198 = local_418;
      if (local_418 == 0) {
        local_17c = 0;
      }
      else {
        local_17c = memcmp(local_658,local_668[0],local_418);
      }
      bVar4 = local_17c == 0;
    }
    if (bVar4) {
      llvm::StringRef::operator_cast_to_string(&local_688,(StringRef *)&this_local);
      std::__cxx11::string::operator=((string *)&this->moduleName,(string *)&local_688);
      std::__cxx11::string::~string((string *)&local_688);
    }
    else {
      local_698 = (void *)value_local.Length;
      local_130 = local_6a8;
      local_138 = "module-output-path";
      local_6a8[0] = "module-output-path";
      local_690 = sVar3;
      local_448 = strlen("module-output-path");
      local_430 = local_698;
      local_428 = local_690;
      local_440 = local_6a8[0];
      local_450 = local_6a8[0];
      local_388 = local_6a8[0];
      local_390 = &local_430;
      bVar4 = false;
      local_438 = local_448;
      local_380 = local_448;
      if (local_690 == local_448) {
        local_1a8 = local_698;
        local_1b0 = local_6a8[0];
        local_1b8 = local_448;
        if (local_448 == 0) {
          local_19c = 0;
        }
        else {
          local_19c = memcmp(local_698,local_6a8[0],local_448);
        }
        bVar4 = local_19c == 0;
      }
      sVar1 = value_local.Length;
      if (bVar4) {
        llvm::StringRef::operator_cast_to_string(&local_6c8,(StringRef *)&this_local);
        std::__cxx11::string::operator=((string *)&this->moduleOutputPath,(string *)&local_6c8);
        std::__cxx11::string::~string((string *)&local_6c8);
      }
      else {
        local_120 = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer + 8;
        local_128 = "sources";
        sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
        super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = anon_var_dwarf_25e127;
        local_478 = strlen("sources");
        local_460 = sVar1;
        local_470[0] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[8];
        local_470[1] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[9];
        local_470[2] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[10];
        local_470[3] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
        local_470[4] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
        local_470[5] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
        local_470[6] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
        local_470[7] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
        local_480[0] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[8];
        local_480[1] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[9];
        local_480[2] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[10];
        local_480[3] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
        local_480[4] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
        local_480[5] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
        local_480[6] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
        local_480[7] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
        local_370[0] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[8];
        local_370[1] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[9];
        local_370[2] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[10];
        local_370[3] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
        local_370[4] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
        local_370[5] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
        local_370[6] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
        local_370[7] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
        local_378 = &local_460;
        bVar4 = false;
        local_468 = local_478;
        local_458 = sVar3;
        local_368 = local_478;
        if (sVar3 == local_478) {
          local_1c8 = sVar1;
          local_1d0[0] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[8];
          local_1d0[1] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[9];
          local_1d0[2] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[10];
          local_1d0[3] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
          local_1d0[4] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
          local_1d0[5] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
          local_1d0[6] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
          local_1d0[7] = sources.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
          local_1d8 = local_478;
          if (local_478 == 0) {
            local_1bc = 0;
          }
          else {
            local_1bc = memcmp((void *)sVar1,
                               (void *)sources.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer.
                                       _8_8_,local_478);
          }
          bVar4 = local_1bc == 0;
        }
        sVar1 = value_local.Length;
        if (bVar4) {
          llvm::SmallVector<llvm::StringRef,_32U>::SmallVector
                    ((SmallVector<llvm::StringRef,_32U> *)local_8f8);
          local_908.Data = (char *)this_local;
          local_908.Length = (size_t)value_local.Data;
          local_110 = &local_918;
          local_118 = " ";
          strlen(" ");
          llvm::StringRef::split
                    (&local_908,(SmallVectorImpl<llvm::StringRef> *)local_8f8,local_918,-1,false);
          local_50 = local_8f8;
          local_18 = (SmallVectorBase *)local_8f8;
          local_10 = local_18;
          sVar3 = llvm::SmallVectorBase::size(local_18);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_931);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<llvm::StringRef*,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_930
                     ,(StringRef *)local_8f8,(StringRef *)((long)local_8f8 + sVar3 * 0x10),
                     &local_931);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->sourcesList,&local_930);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_930);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_931);
          llvm::SmallVector<llvm::StringRef,_32U>::~SmallVector
                    ((SmallVector<llvm::StringRef,_32U> *)local_8f8);
        }
        else {
          local_100 = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                      super_AlignedCharArray<8UL,_16UL>.buffer + 8;
          local_108 = "objects";
          objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
          super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = anon_var_dwarf_20ace2;
          local_4a8 = strlen("objects");
          local_490 = sVar1;
          local_4a0[0] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[8];
          local_4a0[1] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[9];
          local_4a0[2] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[10];
          local_4a0[3] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
          local_4a0[4] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
          local_4a0[5] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
          local_4a0[6] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
          local_4a0[7] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
          local_4b0[0] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[8];
          local_4b0[1] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[9];
          local_4b0[2] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[10];
          local_4b0[3] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
          local_4b0[4] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
          local_4b0[5] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
          local_4b0[6] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
          local_4b0[7] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
          local_358[0] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[8];
          local_358[1] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[9];
          local_358[2] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[10];
          local_358[3] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
          local_358[4] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
          local_358[5] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
          local_358[6] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
          local_358[7] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                         super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
          local_360 = &local_490;
          bVar4 = false;
          local_498 = local_4a8;
          local_488 = sVar3;
          local_350 = local_4a8;
          if (sVar3 == local_4a8) {
            local_1e8 = sVar1;
            local_1f0[0] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[8];
            local_1f0[1] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[9];
            local_1f0[2] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[10];
            local_1f0[3] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
            local_1f0[4] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
            local_1f0[5] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
            local_1f0[6] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
            local_1f0[7] = objects.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
            local_1f8 = local_4a8;
            if (local_4a8 == 0) {
              local_1dc = 0;
            }
            else {
              local_1dc = memcmp((void *)sVar1,
                                 (void *)objects.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                         InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer.
                                         _8_8_,local_4a8);
            }
            bVar4 = local_1dc == 0;
          }
          sVar1 = value_local.Length;
          if (bVar4) {
            llvm::SmallVector<llvm::StringRef,_32U>::SmallVector
                      ((SmallVector<llvm::StringRef,_32U> *)local_b68);
            local_b78.Data = (char *)this_local;
            local_b78.Length = (size_t)value_local.Data;
            local_f0 = &local_b88;
            local_f8 = " ";
            strlen(" ");
            llvm::StringRef::split
                      (&local_b78,(SmallVectorImpl<llvm::StringRef> *)local_b68,local_b88,-1,false);
            local_58 = local_b68;
            local_28 = (SmallVectorBase *)local_b68;
            local_20 = local_28;
            sVar3 = llvm::SmallVectorBase::size(local_28);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator(&local_ba1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            vector<llvm::StringRef*,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_ba0,(StringRef *)local_b68,
                       (StringRef *)((long)local_b68 + sVar3 * 0x10),&local_ba1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&this->objectsList,&local_ba0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_ba0);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator(&local_ba1);
            llvm::SmallVector<llvm::StringRef,_32U>::~SmallVector
                      ((SmallVector<llvm::StringRef,_32U> *)local_b68);
          }
          else {
            local_e0 = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                       super_AlignedCharArray<8UL,_16UL>.buffer + 8;
            local_e8 = "import-paths";
            imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
            super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = anon_var_dwarf_25e141;
            local_4d8 = strlen("import-paths");
            local_4c0 = sVar1;
            local_4d0[0] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[8];
            local_4d0[1] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[9];
            local_4d0[2] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[10];
            local_4d0[3] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
            local_4d0[4] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
            local_4d0[5] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
            local_4d0[6] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
            local_4d0[7] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
            local_4e0[0] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[8];
            local_4e0[1] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[9];
            local_4e0[2] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[10];
            local_4e0[3] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
            local_4e0[4] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
            local_4e0[5] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
            local_4e0[6] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
            local_4e0[7] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
            local_340[0] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[8];
            local_340[1] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[9];
            local_340[2] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[10];
            local_340[3] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
            local_340[4] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
            local_340[5] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
            local_340[6] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
            local_340[7] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                           super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
            local_348 = &local_4c0;
            bVar4 = false;
            local_4c8 = local_4d8;
            local_4b8 = sVar3;
            local_338 = local_4d8;
            if (sVar3 == local_4d8) {
              local_208 = sVar1;
              local_210[0] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f]
                             .super_AlignedCharArray<8UL,_16UL>.buffer[8];
              local_210[1] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f]
                             .super_AlignedCharArray<8UL,_16UL>.buffer[9];
              local_210[2] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f]
                             .super_AlignedCharArray<8UL,_16UL>.buffer[10];
              local_210[3] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f]
                             .super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
              local_210[4] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f]
                             .super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
              local_210[5] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f]
                             .super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
              local_210[6] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f]
                             .super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
              local_210[7] = imports.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f]
                             .super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
              local_218 = local_4d8;
              if (local_4d8 == 0) {
                local_1fc = 0;
              }
              else {
                local_1fc = memcmp((void *)sVar1,
                                   (void *)imports.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                           InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer
                                           ._8_8_,local_4d8);
              }
              bVar4 = local_1fc == 0;
            }
            if (bVar4) {
              llvm::SmallVector<llvm::StringRef,_32U>::SmallVector
                        ((SmallVector<llvm::StringRef,_32U> *)local_dd8);
              local_de8.Data = (char *)this_local;
              local_de8.Length = (size_t)value_local.Data;
              local_d0 = &local_df8;
              local_d8 = " ";
              strlen(" ");
              llvm::StringRef::split
                        (&local_de8,(SmallVectorImpl<llvm::StringRef> *)local_dd8,local_df8,-1,false
                        );
              local_60 = local_dd8;
              local_38 = (SmallVectorBase *)local_dd8;
              local_30 = local_38;
              sVar3 = llvm::SmallVectorBase::size(local_38);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_e11);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              vector<llvm::StringRef*,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_e10,(StringRef *)local_dd8,
                         (StringRef *)((long)local_dd8 + sVar3 * 0x10),&local_e11);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(&this->importPaths,&local_e10);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_e10);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_e11);
              llvm::SmallVector<llvm::StringRef,_32U>::~SmallVector
                        ((SmallVector<llvm::StringRef,_32U> *)local_dd8);
            }
            else {
              local_e28 = (void *)value_local.Length;
              local_c0 = local_e38;
              local_c8 = "temps-path";
              local_e38[0] = "temps-path";
              local_e20 = sVar3;
              local_508 = strlen("temps-path");
              local_4f0 = local_e28;
              local_4e8 = local_e20;
              local_500 = local_e38[0];
              local_510 = local_e38[0];
              local_328 = local_e38[0];
              local_330 = &local_4f0;
              bVar4 = false;
              local_4f8 = local_508;
              local_320 = local_508;
              if (local_e20 == local_508) {
                local_228 = local_e28;
                local_230 = local_e38[0];
                local_238 = local_508;
                if (local_508 == 0) {
                  local_21c = 0;
                }
                else {
                  local_21c = memcmp(local_e28,local_e38[0],local_508);
                }
                bVar4 = local_21c == 0;
              }
              if (bVar4) {
                llvm::StringRef::operator_cast_to_string(&local_e58,(StringRef *)&this_local);
                std::__cxx11::string::operator=((string *)&this->tempsPath,(string *)&local_e58);
                std::__cxx11::string::~string((string *)&local_e58);
              }
              else {
                local_e68 = (void *)value_local.Length;
                local_b0 = local_e78;
                local_b8 = "is-library";
                local_e78[0] = "is-library";
                local_e60 = sVar3;
                local_538 = strlen("is-library");
                local_520 = local_e68;
                local_518 = local_e60;
                local_530 = local_e78[0];
                local_540 = local_e78[0];
                local_310 = local_e78[0];
                local_318 = &local_520;
                bVar4 = false;
                local_528 = local_538;
                local_308 = local_538;
                if (local_e60 == local_538) {
                  local_248 = local_e68;
                  local_250 = local_e78[0];
                  local_258 = local_538;
                  if (local_538 == 0) {
                    local_23c = 0;
                  }
                  else {
                    local_23c = memcmp(local_e68,local_e78[0],local_538);
                  }
                  bVar4 = local_23c == 0;
                }
                if (bVar4) {
                  local_e88 = value_local.Length;
                  local_e98 = this_local;
                  local_e90 = value_local.Data;
                  name_02.Length = sVar3;
                  name_02.Data = (char *)value_local.Length;
                  value_00.Length = (size_t)value_local.Data;
                  value_00.Data = (char *)this_local;
                  local_e80 = sVar3;
                  bVar4 = configureBool(this,local_608,&this->isLibrary,name_02,value_00);
                  if (!bVar4) {
                    return false;
                  }
                }
                else {
                  local_ea8 = (void *)value_local.Length;
                  local_a0 = local_eb8;
                  local_a8 = "enable-whole-module-optimization";
                  local_eb8[0] = "enable-whole-module-optimization";
                  local_ea0 = sVar3;
                  local_568 = strlen("enable-whole-module-optimization");
                  local_550 = local_ea8;
                  local_548 = local_ea0;
                  local_560 = local_eb8[0];
                  local_570 = local_eb8[0];
                  local_2f8 = local_eb8[0];
                  local_300 = &local_550;
                  bVar4 = false;
                  local_558 = local_568;
                  local_2f0 = local_568;
                  if (local_ea0 == local_568) {
                    local_268 = local_ea8;
                    local_270 = local_eb8[0];
                    local_278 = local_568;
                    if (local_568 == 0) {
                      local_25c = 0;
                    }
                    else {
                      local_25c = memcmp(local_ea8,local_eb8[0],local_568);
                    }
                    bVar4 = local_25c == 0;
                  }
                  if (bVar4) {
                    local_ec8 = value_local.Length;
                    local_ed8 = this_local;
                    local_ed0 = value_local.Data;
                    name_01.Length = sVar3;
                    name_01.Data = (char *)value_local.Length;
                    value_01.Length = (size_t)value_local.Data;
                    value_01.Data = (char *)this_local;
                    local_ec0 = sVar3;
                    bVar4 = configureBool(this,local_608,&this->enableWholeModuleOptimization,
                                          name_01,value_01);
                    if (!bVar4) {
                      return false;
                    }
                  }
                  else {
                    local_ee8 = (void *)value_local.Length;
                    local_90 = (undefined1 *)&stack0xfffffffffffff108;
                    local_98 = "num-threads";
                    pcStack_ef8 = "num-threads";
                    local_ee0 = sVar3;
                    local_598 = strlen("num-threads");
                    local_580 = local_ee8;
                    local_578 = local_ee0;
                    local_590 = pcStack_ef8;
                    local_5a0 = pcStack_ef8;
                    local_2e0 = pcStack_ef8;
                    local_2e8 = &local_580;
                    bVar4 = false;
                    local_588 = local_598;
                    local_2d8 = local_598;
                    if (local_ee0 == local_598) {
                      local_288 = local_ee8;
                      local_290 = pcStack_ef8;
                      local_298 = local_598;
                      if (local_598 == 0) {
                        local_27c = 0;
                      }
                      else {
                        local_27c = memcmp(local_ee8,pcStack_ef8,local_598);
                      }
                      bVar4 = local_27c == 0;
                    }
                    sVar1 = value_local.Length;
                    if (bVar4) {
                      local_efc = 0;
                      tVar2 = llvm::StringRef::getAsInteger<int>
                                        ((StringRef *)&this_local,10,&local_efc);
                      this_00 = local_608;
                      if (tVar2) {
                        llvm::operator+(&local_f30,"\'",(StringRef *)&value_local.Length);
                        llvm::Twine::Twine(&local_f48,"\' should be an int.");
                        llvm::operator+(&local_f18,&local_f30,&local_f48);
                        llbuild::buildsystem::ConfigureContext::error(this_00,&local_f18);
                        return false;
                      }
                      if (local_efc < 0) {
                        llvm::operator+(&local_f78,"\'",(StringRef *)&value_local.Length);
                        llvm::Twine::Twine(&local_f90,"\' should be greater than or equal to zero.")
                        ;
                        llvm::operator+(&local_f60,&local_f78,&local_f90);
                        llbuild::buildsystem::ConfigureContext::error(this_00,&local_f60);
                        return false;
                      }
                      llvm::StringRef::operator_cast_to_string(&local_fb0,(StringRef *)&this_local);
                      std::__cxx11::string::operator=
                                ((string *)&this->numThreads,(string *)&local_fb0);
                      std::__cxx11::string::~string((string *)&local_fb0);
                    }
                    else {
                      local_80 = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                 [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer + 8;
                      local_88 = "other-args";
                      args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                      super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = anon_var_dwarf_25dd0d;
                      local_2c0 = strlen("other-args");
                      local_5b0 = sVar1;
                      local_2c8[0] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                     [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[8];
                      local_2c8[1] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                     [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[9];
                      local_2c8[2] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                     [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[10];
                      local_2c8[3] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                     [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
                      local_2c8[4] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                     [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
                      local_2c8[5] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                     [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
                      local_2c8[6] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                     [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
                      local_2c8[7] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts
                                     [0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
                      local_2d0 = &local_5b0;
                      bVar4 = false;
                      local_5a8 = sVar3;
                      if (sVar3 == local_2c0) {
                        local_2a8 = sVar1;
                        local_2b0[0] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[8];
                        local_2b0[1] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[9];
                        local_2b0[2] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer[10]
                        ;
                        local_2b0[3] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer
                                       [0xb];
                        local_2b0[4] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer
                                       [0xc];
                        local_2b0[5] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer
                                       [0xd];
                        local_2b0[6] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer
                                       [0xe];
                        local_2b0[7] = args.super_SmallVectorStorage<llvm::StringRef,_32U>.
                                       InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>.buffer
                                       [0xf];
                        local_2b8 = local_2c0;
                        if (local_2c0 == 0) {
                          local_29c = 0;
                        }
                        else {
                          local_29c = memcmp((void *)sVar1,
                                             (void *)args.
                                                  super_SmallVectorStorage<llvm::StringRef,_32U>.
                                                  InlineElts[0x1f].super_AlignedCharArray<8UL,_16UL>
                                                  .buffer._8_8_,local_2c0);
                        }
                        bVar4 = local_29c == 0;
                      }
                      if (!bVar4) {
                        name_00.Length = sVar3;
                        name_00.Data = (char *)value_local.Length;
                        value_02.Length = (size_t)value_local.Data;
                        value_02.Data = (char *)this_local;
                        bVar4 = llbuild::buildsystem::ExternalCommand::configureAttribute
                                          (&this->super_ExternalCommand,local_608,name_00,value_02);
                        return bVar4;
                      }
                      llvm::SmallVector<llvm::StringRef,_32U>::SmallVector
                                ((SmallVector<llvm::StringRef,_32U> *)local_11e0);
                      local_11f0.Data = (char *)this_local;
                      local_11f0.Length = (size_t)value_local.Data;
                      local_70 = &local_1200;
                      local_78 = " ";
                      strlen(" ");
                      llvm::StringRef::split
                                (&local_11f0,(SmallVectorImpl<llvm::StringRef> *)local_11e0,
                                 local_1200,-1,false);
                      local_68 = local_11e0;
                      local_48 = (SmallVectorBase *)local_11e0;
                      local_40 = local_48;
                      sVar3 = llvm::SmallVectorBase::size(local_48);
                      std::
                      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::allocator(&local_1219);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      vector<llvm::StringRef*,void>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_1218,(StringRef *)local_11e0,
                                 (StringRef *)((long)local_11e0 + sVar3 * 0x10),&local_1219);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator=(&this->otherArgs,&local_1218);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_1218);
                      std::
                      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~allocator(&local_1219);
                      llvm::SmallVector<llvm::StringRef,_32U>::~SmallVector
                                ((SmallVector<llvm::StringRef,_32U> *)local_11e0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "executable") {
      executable = value;
    } else if (name == "module-name") {
      moduleName = value;
    } else if (name == "module-output-path") {
      moduleOutputPath = value;
    } else if (name == "sources") {
      SmallVector<StringRef, 32> sources;
      StringRef(value).split(sources, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      sourcesList = std::vector<std::string>(sources.begin(), sources.end());
    } else if (name == "objects") {
      SmallVector<StringRef, 32> objects;
      StringRef(value).split(objects, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      objectsList = std::vector<std::string>(objects.begin(), objects.end());
    } else if (name == "import-paths") {
      SmallVector<StringRef, 32> imports;
      StringRef(value).split(imports, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      importPaths = std::vector<std::string>(imports.begin(), imports.end());
    } else if (name == "temps-path") {
      tempsPath = value;
    } else if (name == "is-library") {
      if (!configureBool(ctx, isLibrary, name, value))
        return false;
    } else if (name == "enable-whole-module-optimization") {
      if (!configureBool(ctx, enableWholeModuleOptimization, name, value))
        return false;
    } else if (name == "num-threads") {
      int numThreadsInt = 0;
      if (value.getAsInteger(10, numThreadsInt)) {
        ctx.error("'" + name + "' should be an int.");
        return false;
      }
      if (numThreadsInt < 0) {
        ctx.error("'" + name + "' should be greater than or equal to zero.");
        return false;
      }
      numThreads = value;
    } else if (name == "other-args") {
      SmallVector<StringRef, 32> args;
      StringRef(value).split(args, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      otherArgs = std::vector<std::string>(args.begin(), args.end());
    } else {
      return ExternalCommand::configureAttribute(ctx, name, value);
    }

    return true;
  }